

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int handleDeferredMoveto(VdbeCursor *p)

{
  int iVar1;
  int res;
  int local_c;
  
  iVar1 = sqlite3BtreeMovetoUnpacked
                    ((p->uc).pCursor,(UnpackedRecord *)0x0,p->movetoTarget,0,&local_c);
  if (iVar1 == 0) {
    if (local_c != 0) {
      iVar1 = sqlite3CorruptError(0x134cb);
      return iVar1;
    }
    p->deferredMoveto = '\0';
    p->cacheStatus = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int SQLITE_NOINLINE handleDeferredMoveto(VdbeCursor *p){
  int res, rc;
#ifdef SQLITE_TEST
  extern int sqlite3_search_count;
#endif
  assert( p->deferredMoveto );
  assert( p->isTable );
  assert( p->eCurType==CURTYPE_BTREE );
  rc = sqlite3BtreeMovetoUnpacked(p->uc.pCursor, 0, p->movetoTarget, 0, &res);
  if( rc ) return rc;
  if( res!=0 ) return SQLITE_CORRUPT_BKPT;
#ifdef SQLITE_TEST
  sqlite3_search_count++;
#endif
  p->deferredMoveto = 0;
  p->cacheStatus = CACHE_STALE;
  return SQLITE_OK;
}